

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  TPZGeoEl *sideorient_00;
  TPZGeoNode *this_00;
  long *plVar3;
  TPZConnect *this_01;
  uint *puVar4;
  pair<int,_long> *this_02;
  long in_RSI;
  long *in_RDI;
  int ish;
  int nvec_shape;
  TPZShapeData *shapedata;
  int i_2;
  int i_1;
  int i;
  TPZGeoEl *gel;
  TPZManVector<int,_4> sideorient;
  TPZVec<int> *in_stack_000000e8;
  TPZVec<long> *in_stack_000000f0;
  TPZManVector<int,_9> orders;
  TPZManVector<long,_4> ids;
  undefined8 in_stack_fffffffffffffe68;
  TPZShapeData *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar5;
  int *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  int64_t in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  TPZManVector<std::pair<int,_long>,_20> *in_stack_fffffffffffffee0;
  TPZFMatrix<double> *in_stack_fffffffffffffee8;
  int local_110;
  int local_10c;
  long local_108;
  int local_fc;
  int iVar6;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar7;
  TPZVec<long> *in_stack_ffffffffffffff20;
  TPZVec<int> local_98 [2];
  TPZVec<long> local_50 [2];
  long local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (int64_t)in_stack_fffffffffffffe88);
  TPZManVector<int,_9>::TPZManVector
            ((TPZManVector<int,_9> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98,
             (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  uVar7 = 0;
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98,
             (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  sideorient_00 =
       TPZCompEl::Reference
                 ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)
                                CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                in_stack_fffffffffffffe7c);
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](local_50,(long)iVar6);
    *plVar3 = (long)iVar2;
  }
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar2);
    bVar1 = TPZConnect::Order(this_01);
    in_stack_fffffffffffffe94 = (uint)bVar1;
    puVar4 = (uint *)TPZVec<int>::operator[](local_98,(long)iVar2);
    *puVar4 = in_stack_fffffffffffffe94;
  }
  for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
    in_stack_fffffffffffffe90 =
         SideOrient((TPZCompElHDiv<pzshape::TPZShapeQuad> *)in_stack_fffffffffffffe70,
                    (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    in_stack_fffffffffffffe88 =
         TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff20,(long)local_fc);
    *in_stack_fffffffffffffe88 = in_stack_fffffffffffffe90;
  }
  local_108 = local_10;
  local_10c = 0;
  iVar5 = (int)in_RDI[0x1c];
  if (iVar5 == 0) {
    TPZShapeHDiv<pzshape::TPZShapeQuad>::Initialize
              (in_stack_000000f0,in_stack_000000e8,(TPZVec<int> *)sideorient.fExtAlloc._8_8_,
               (TPZShapeData *)sideorient.fExtAlloc._0_8_);
    in_stack_fffffffffffffe80 =
         TPZShapeHDiv<pzshape::TPZShapeQuad>::NShapeF(in_stack_fffffffffffffe70);
    local_10c = in_stack_fffffffffffffe80;
  }
  else if (iVar5 == 1) {
    TPZShapeHDivConstant<pzshape::TPZShapeQuad>::Initialize
              (in_stack_ffffffffffffff20,(TPZVec<int> *)CONCAT44(uVar7,in_stack_ffffffffffffff18),
               (TPZVec<int> *)sideorient_00,(TPZShapeData *)CONCAT44(iVar6,iVar2));
    local_10c = (**(code **)(*in_RDI + 600))();
  }
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffee8,(int64_t)in_stack_fffffffffffffee0,(int64_t)in_RDI);
  TPZManVector<std::pair<int,_long>,_20>::Resize(in_stack_fffffffffffffee0,(int64_t)in_RDI);
  for (local_110 = 0; local_110 < local_10c; local_110 = local_110 + 1) {
    in_stack_fffffffffffffe70 =
         (TPZShapeData *)
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (int64_t)in_stack_fffffffffffffe88,CONCAT44(iVar5,in_stack_fffffffffffffe80));
    *(double *)in_stack_fffffffffffffe70 = 1.0;
    std::pair<int,_long>::pair<int_&,_int_&,_true>
              ((pair<int,_long> *)&stack0xfffffffffffffee0,&local_110,&local_110);
    this_02 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_110);
    std::pair<int,_long>::operator=(this_02,(type)&stack0xfffffffffffffee0);
  }
  *(undefined4 *)(local_10 + 8) = 3;
  TPZManVector<int,_4>::~TPZManVector((TPZManVector<int,_4> *)in_stack_fffffffffffffe70);
  TPZManVector<int,_9>::~TPZManVector((TPZManVector<int,_9> *)in_stack_fffffffffffffe70);
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffe70);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}